

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O0

Vector * __thiscall
KDIS::DATA_TYPE::Vector::operator*(Vector *__return_storage_ptr__,Vector *this,KFLOAT64 Value)

{
  KFLOAT64 Value_local;
  Vector *this_local;
  Vector *tmp;
  
  Vector(__return_storage_ptr__,this);
  __return_storage_ptr__->m_f32X =
       (KFLOAT32)(float)((double)(float)__return_storage_ptr__->m_f32X * (double)Value);
  __return_storage_ptr__->m_f32Y =
       (KFLOAT32)(float)((double)(float)__return_storage_ptr__->m_f32Y * (double)Value);
  __return_storage_ptr__->m_f32Z =
       (KFLOAT32)(float)((double)(float)__return_storage_ptr__->m_f32Z * (double)Value);
  return __return_storage_ptr__;
}

Assistant:

Vector Vector::operator * ( KFLOAT64 Value ) const
{
    Vector tmp = *this;
    tmp.m_f32X *= Value;
    tmp.m_f32Y *= Value;
    tmp.m_f32Z *= Value;
    return tmp;
}